

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularStringView::GenerateAccessorDeclarations
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  Printer *local_150;
  pointer local_148;
  pointer local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [24];
  undefined1 local_110 [17];
  undefined7 uStack_ff;
  size_type sStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  code *local_e0;
  code *local_d8;
  undefined1 local_d0;
  undefined1 **local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8 [80];
  FieldDescriptor local_58 [8];
  char *local_50;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  
  local_128._0_8_ = 0;
  local_128._8_8_ = "";
  local_150 = p;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_110,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)(local_138 + 0x10),
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(1),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = ((long)(local_110._8_8_ - local_110._0_8_) >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_110._0_8_;
  io::Printer::WithDefs(&local_48,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_110);
  pPVar1 = local_150;
  local_58 = (FieldDescriptor  [8])0x4;
  local_50 = "set_";
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_110,(cpp *)(this->super_FieldGeneratorBase).field_,local_58,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_00.len_ = ((long)(local_110._8_8_ - local_110._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_110._0_8_;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)(local_138 + 0x10),pPVar1,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_110);
  pPVar1 = local_150;
  local_148 = (pointer)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"donated","");
  if (local_148 == (pointer)local_138) {
    sStack_f8 = local_138._8_8_;
    local_110._0_8_ = (pointer)((long)local_110 + 0x10U);
  }
  else {
    local_110._0_8_ = local_148;
  }
  uStack_ff = local_138._1_7_;
  local_110[0x10] = local_138[0];
  local_110._8_8_ = local_140;
  local_140 = (pointer)0x0;
  local_138[0] = 0;
  local_148 = (pointer)local_138;
  local_f0._M_allocated_capacity = (size_type)operator_new(0x18);
  *(SingularStringView **)local_f0._M_allocated_capacity = this;
  *(Printer ***)(local_f0._M_allocated_capacity + 8) = &local_150;
  *(undefined1 *)(local_f0._M_allocated_capacity + 0x10) = 0;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_f0._8_8_ = 0;
  local_e0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_d0 = 1;
  local_c0._0_1_ = '\0';
  local_c0._1_7_ = 0;
  local_b8 = 0;
  local_a8[0] = '\0';
  local_c8 = (undefined1 **)&local_b8;
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,0x36a4ec);
  local_a8[0x48] = false;
  google::protobuf::io::Printer::Emit
            (pPVar1,(vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                     *)local_110,1,0x173,
             "\n        $DEPRECATED$ absl::string_view $name$() const;\n        template <typename Arg_ = std::string&&>\n        $DEPRECATED$ void $set_name$(Arg_&& arg);\n\n        private:\n        const std::string& _internal_$name$() const;\n        inline PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(\n            absl::string_view value);\n        $donated$;\n\n        public:\n      "
            );
  if ((bool)local_a8[0x48] == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               (local_a8 + 8));
  }
  if (local_c8 != (undefined1 **)&local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[(byte)local_d0]._M_data)
            ((anon_class_1_0_00000001 *)local_58,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)&local_f0);
  local_d0 = 0xff;
  if ((pointer)local_110._0_8_ != (pointer)((long)local_110 + 0x10U)) {
    operator_delete((void *)local_110._0_8_,(ulong)(stack0xffffffffffffff00 + 1));
  }
  if (local_148 != (pointer)local_138) {
    operator_delete(local_148,CONCAT71(local_138._1_7_,local_138[0]) + 1);
  }
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)(local_138 + 0x10));
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_48);
  return;
}

Assistant:

void SingularStringView::GenerateAccessorDeclarations(io::Printer* p) const {
  auto v1 = p->WithVars(AnnotatedAccessors(field_, {""}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));

  p->Emit(
      {{"donated",
        [&] {
          if (!is_inlined()) return;
          p->Emit(R"cc(
            inline PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
          )cc");
        }}},
      R"cc(
        $DEPRECATED$ absl::string_view $name$() const;
        template <typename Arg_ = std::string&&>
        $DEPRECATED$ void $set_name$(Arg_&& arg);

        private:
        const std::string& _internal_$name$() const;
        inline PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(
            absl::string_view value);
        $donated$;

        public:
      )cc");
}